

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O2

void __thiscall
loguru::LogScopeRAII::LogScopeRAII
          (LogScopeRAII *this,Verbosity verbosity,char *file,uint line,char *format,...)

{
  long lVar1;
  char in_AL;
  Callback *p;
  longlong lVar2;
  long lVar3;
  int iVar4;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list vlist;
  undefined1 local_e8 [40];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  this->_verbosity = verbosity;
  this->_file = file;
  this->_line = line;
  iVar4 = s_max_out_verbosity;
  if (s_max_out_verbosity < g_stderr_verbosity) {
    iVar4 = g_stderr_verbosity;
  }
  if (iVar4 < verbosity) {
    this->_file = (char *)0x0;
  }
  else {
    local_c0 = in_R9;
    std::recursive_mutex::lock((recursive_mutex *)s_mutex);
    this->_indent_stderr = verbosity <= g_stderr_verbosity;
    lVar2 = std::chrono::_V2::system_clock::now();
    this->_start_time_ns = lVar2;
    vlist[0].reg_save_area = local_e8;
    vlist[0].overflow_arg_area = &stack0x00000008;
    vlist[0].gp_offset = 0x28;
    vlist[0].fp_offset = 0x30;
    vsnprintf(this->_name,0xc4,format,vlist);
    log_to_everywhere(1,this->_verbosity,file,line,"{ ",this->_name);
    lVar1 = DAT_0015d9f0;
    lVar3 = s_callbacks;
    if (this->_indent_stderr == true) {
      LOCK();
      s_stderr_indentation = s_stderr_indentation + 1;
      UNLOCK();
    }
    for (; lVar3 != lVar1; lVar3 = lVar3 + 0x50) {
      if (verbosity <= *(int *)(lVar3 + 0x30)) {
        *(int *)(lVar3 + 0x48) = *(int *)(lVar3 + 0x48) + 1;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)s_mutex);
  }
  return;
}

Assistant:

LogScopeRAII::LogScopeRAII(Verbosity verbosity, const char* file, unsigned line, const char* format, ...)
		: _verbosity(verbosity), _file(file), _line(line)
	{
		if (verbosity <= current_verbosity_cutoff()) {
			std::lock_guard<std::recursive_mutex> lock(s_mutex);
			_indent_stderr = (verbosity <= g_stderr_verbosity);
			_start_time_ns = now_ns();
			va_list vlist;
			va_start(vlist, format);
			vsnprintf(_name, sizeof(_name), format, vlist);
			log_to_everywhere(1, _verbosity, file, line, "{ ", _name);
			va_end(vlist);

			if (_indent_stderr) {
				++s_stderr_indentation;
			}

			for (auto& p : s_callbacks) {
				if (verbosity <= p.verbosity) {
					++p.indentation;
				}
			}
		} else {
			_file = nullptr;
		}
	}